

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseProcessorLatencyDeclaration(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  Processor *pPVar3;
  CompileMessage local_108;
  int local_cc;
  pool_ptr<soul::AST::Expression> local_c8;
  CompileMessage local_c0;
  pool_ptr<soul::AST::ModuleBase> local_88;
  pool_ptr<soul::AST::Processor> local_80;
  pool_ptr<soul::AST::Processor> p;
  Expression *value;
  CompileMessage local_50;
  ProcessorProperty *local_18;
  ProcessorProperty *pp;
  StructuralParser *this_local;
  
  pp = (ProcessorProperty *)this;
  local_18 = parseProcessorProperty(this);
  if (*(int *)&(local_18->super_Expression).field_0x2c != 5) {
    pEVar2 = &local_18->super_Expression;
    Errors::expectedFunctionOrVariable<>();
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_50,false);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
  pEVar2 = parseExpression(this,false);
  p.object = (Processor *)0x54c9e0;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
  local_88.object = (this->module).object;
  cast<soul::AST::Processor,soul::AST::ModuleBase>((soul *)&local_80,&local_88);
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_88);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_80);
  if (bVar1) {
    pPVar3 = pool_ptr<soul::AST::Processor>::operator->(&local_80);
    bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&pPVar3->latency,(void *)0x0);
    if (bVar1) {
      pEVar2 = &local_18->super_Expression;
      Errors::latencyAlreadyDeclared<>();
      AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_c0,false);
    }
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_c8,pEVar2);
    pPVar3 = pool_ptr<soul::AST::Processor>::operator->(&local_80);
    (pPVar3->latency).object = local_c8.object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_c8);
    local_cc = 1;
  }
  else {
    local_cc = 0;
  }
  pool_ptr<soul::AST::Processor>::~pool_ptr(&local_80);
  if (local_cc != 0) {
    return;
  }
  pEVar2 = &local_18->super_Expression;
  Errors::latencyOnlyForProcessor<>();
  AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_108,false);
}

Assistant:

void parseProcessorLatencyDeclaration()
    {
        auto& pp = parseProcessorProperty();

        if (pp.property != heart::ProcessorProperty::Property::latency)
            pp.context.throwError (Errors::expectedFunctionOrVariable());

        expect (Operator::assign);
        auto& value = parseExpression();
        expect (Operator::semicolon);

        if (auto p = cast<AST::Processor> (module))
        {
            if (p->latency != nullptr)
                pp.context.throwError (Errors::latencyAlreadyDeclared());

            p->latency = value;
            return;
        }

        pp.context.throwError (Errors::latencyOnlyForProcessor());
    }